

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5ExprNodeZeroPoslist(Fts5ExprNode *pNode)

{
  Fts5ExprNearset *pFVar1;
  int local_2c;
  int i_1;
  Fts5ExprPhrase *pPhrase;
  int i;
  Fts5ExprNearset *pNear;
  Fts5ExprNode *pNode_local;
  
  if ((pNode->eType == 9) || (pNode->eType == 4)) {
    pFVar1 = pNode->pNear;
    for (pPhrase._4_4_ = 0; pPhrase._4_4_ < pFVar1->nPhrase; pPhrase._4_4_ = pPhrase._4_4_ + 1) {
      (pFVar1->apPhrase[pPhrase._4_4_]->poslist).n = 0;
    }
  }
  else {
    for (local_2c = 0; local_2c < pNode->nChild; local_2c = local_2c + 1) {
      fts5ExprNodeZeroPoslist(pNode->apChild[local_2c]);
    }
  }
  return;
}

Assistant:

static void fts5ExprNodeZeroPoslist(Fts5ExprNode *pNode){
  if( pNode->eType==FTS5_STRING || pNode->eType==FTS5_TERM ){
    Fts5ExprNearset *pNear = pNode->pNear;
    int i;
    for(i=0; i<pNear->nPhrase; i++){
      Fts5ExprPhrase *pPhrase = pNear->apPhrase[i];
      pPhrase->poslist.n = 0;
    }
  }else{
    int i;
    for(i=0; i<pNode->nChild; i++){
      fts5ExprNodeZeroPoslist(pNode->apChild[i]);
    }
  }
}